

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

mcu8str * mctools_determine_exe_self_path(int argc,char **argv)

{
  int iVar1;
  char *__path;
  undefined8 *in_RDX;
  int in_ESI;
  mcu8str *in_RDI;
  mcu8str *path;
  ssize_t len;
  char buf [65537];
  char *filename;
  int ifile;
  mcu8str *buflen;
  mcu8str *in_stack_fffffffffffeffd0;
  mcu8str *in_stack_ffffffffffff1080;
  int local_14;
  
  local_14 = 0;
  buflen = in_RDI;
  while( true ) {
    if (1 < local_14) {
      if (in_ESI < 1) {
        mcu8str_create_empty();
      }
      else {
        if (*(char *)*in_RDX == '/') {
          mcu8str_create_from_cstr((char *)in_stack_fffffffffffeffd0);
          mctools_pathseps_platform(in_RDI);
          iVar1 = mctools_is_file(in_stack_ffffffffffff1080);
          if (iVar1 != 0) {
            mctools_pathseps_platform(in_RDI);
            return buflen;
          }
          mcu8str_dealloc(in_RDI);
        }
        mcu8str_create_empty();
      }
      return buflen;
    }
    __path = "/proc/curproc/file";
    if (local_14 == 0) {
      __path = "/proc/self/exe";
    }
    mcu8str_create_from_staticbuffer((char *)in_stack_fffffffffffeffd0,(mcu8str_size_t)buflen);
    in_stack_fffffffffffeffd0 =
         (mcu8str *)readlink(__path,in_RDI->c_str,(ulong)(in_RDI->buflen - 1));
    if ((0 < (long)in_stack_fffffffffffeffd0) &&
       ((undefined1 *)((long)&in_stack_fffffffffffeffd0->c_str + 1) <
        (undefined1 *)(ulong)in_RDI->buflen)) break;
    mcu8str_dealloc(in_RDI);
    local_14 = local_14 + 1;
  }
  *(char *)((long)&in_stack_fffffffffffeffd0->c_str + (long)in_RDI->c_str) = '\0';
  in_RDI->size = (uint)in_stack_fffffffffffeffd0;
  mcu8str_ensure_dynamic_buffer(in_stack_fffffffffffeffd0);
  mctools_pathseps_platform(in_RDI);
  return buflen;
}

Assistant:

mcu8str mctools_determine_exe_self_path( int argc, char** argv )
  {
    //First try some platform specific methods not relying on argv0:
#ifdef MC_IS_WINDOWS
    {
      mcwinstr wpath = mc_winstr_create( (mcu8str_size_t)(MAX_PATH<32768
                                                          ?32768:MAX_PATH) +1 );
      DWORD nsize = GetModuleFileNameW(NULL, wpath.c_str, (DWORD)wpath.buflen );
      if ( nsize == 0 || (mcu8str_size_t)(nsize + 2) >= wpath.buflen ) {//+2 is safety
        //failure:
        mc_winstr_dealloc( &wpath );
      } else {
        //success:
        assert( (mcu8str_size_t)(nsize)+2 <= wpath.buflen );//+2 is safety
        wpath.c_str[nsize] = 0;//add null terminator
        wpath.size = nsize;
        mcu8str res = mc_winstr_to_u8str( &wpath );
        mc_winstr_dealloc( &wpath );
        mctools_pathseps_platform(&res);
        return res;
      }
    }
#endif
#ifdef MC_IS_APPLE
    {
      mcu8str path = mcu8str_create( 4096 );
      STDNS uint32_t bufsize = path.buflen;
      int status = _NSGetExecutablePath( path.c_str, &bufsize );
      if ( status == -1 ) {
        //buffer too small, try again
        mcu8str_reserve( &path, bufsize+1 );
        bufsize = path.buflen;
        status = _NSGetExecutablePath( path.c_str, &bufsize );
      }
      if ( status == 0 ) {
        //success! Return (but make sure we do not refer to our static buffer)
        mcu8str_update_size( &path );
        if ( path.size > 0 ) {
          mctools_pathseps_platform(&path);
          return path;
        }
      }
      mcu8str_dealloc(&path);
    }
#endif
#if defined(__unix__) && !defined(MC_IS_APPLE) && !defined(MC_IS_WINDOWS)
    {
      //Try to invoke readlink on relevant file in /proc. Investigate both
      //"/proc/self/exe" (linux) and "/proc/curproc/file" (might work on some
      //BSDs).
      for ( int ifile = 0; ifile < 2; ++ifile ) {
        const char * filename = ( ifile==0
                                  ? "/proc/self/exe"
                                  : "/proc/curproc/file" );

        char buf[65536+1];//PATH_MAX is unreliable so we use huge buffer for
        //simplicity.
        mcu8str path = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
        //NB: ssize_t is from unistd.h, so never exists in std:: namespace.
        ssize_t len = readlink(filename, path.c_str, path.buflen-1 );
        if ( len > 0 && (mcu8str_size_t)(len+1) < path.buflen ) {
          path.c_str[len] = '\0';//readlink does not add terminating null char
          path.size = (mcu8str_size_t)len;
          mcu8str_ensure_dynamic_buffer( &path );
          mctools_pathseps_platform(&path);
          return path;
        }
        mcu8str_dealloc(&path);
      }
    }
#endif
    //Fall back to argv0 analysis. This will probably only happen outside of the
    //three major platforms (win/macos/linux), so most likely this means we are
    //on some sort of BSD variant. If argv[0] is an absolute path and the file
    //at that path exists, we can take that as a somewhat reliable guess:

    if ( !(argc > 0) )
      return mcu8str_create_empty();//not available (rare, but allowed by C std)

    if ( argv[0][0] == '/' ) {
      //Looks like an absolute path:
      mcu8str path = mcu8str_create_from_cstr( argv[0] );
      mctools_pathseps_platform( &path );
      if ( mctools_is_file( &path ) ) {
        mctools_pathseps_platform(&path);
        return path;
      }
      mcu8str_dealloc( &path );
    }

    //We could do more extensive analysis here, but it might give wrong results
    //if we are unlucky.
    return mcu8str_create_empty();
  }